

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcObjectDefinition::~IfcObjectDefinition(IfcObjectDefinition *this)

{
  undefined1 *puVar1;
  pointer pcVar2;
  
  *(undefined8 *)&this[-1].super_IfcRoot.field_0x28 = 0x912198;
  *(undefined8 *)
   &(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10 =
       0x9121c0;
  puVar1 = *(undefined1 **)&this[-1].super_IfcRoot.field_0x88;
  if (puVar1 != &this[-1].super_IfcRoot.field_0x98) {
    operator_delete(puVar1);
  }
  pcVar2 = this[-1].super_IfcRoot.Description.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &this[-1].super_IfcRoot.Description.ptr.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = this[-1].super_IfcRoot.Name.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &this[-1].super_IfcRoot.Name.ptr.field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(&this[-1].super_IfcRoot.field_0x28);
  return;
}

Assistant:

IfcObjectDefinition() : Object("IfcObjectDefinition") {}